

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subscr_storage_vector_based.cpp
# Opt level: O2

void __thiscall
so_5::impl::vector_based_subscr_storage::storage_t::drop_subscription_for_all_states
          (storage_t *this,mbox_t *mbox,type_index *msg_type)

{
  subscr_info_t *psVar1;
  abstract_message_box_t *paVar2;
  _func_int *UNRECOVERED_JUMPTABLE;
  bool bVar3;
  int iVar4;
  undefined4 extraout_var;
  agent_t *paVar5;
  long lVar6;
  long lVar7;
  __normal_iterator<so_5::impl::subscription_storage_common::subscr_info_t_*,_std::vector<so_5::impl::subscription_storage_common::subscr_info_t,_std::allocator<so_5::impl::subscription_storage_common::subscr_info_t>_>_>
  _Var8;
  const_iterator __first;
  __normal_iterator<so_5::impl::subscription_storage_common::subscr_info_t_*,_std::vector<so_5::impl::subscription_storage_common::subscr_info_t,_std::allocator<so_5::impl::subscription_storage_common::subscr_info_t>_>_>
  __it;
  long lVar9;
  undefined8 local_50;
  type_index *local_48;
  undefined8 local_40;
  type_index *local_38;
  
  iVar4 = (*mbox->m_obj->_vptr_abstract_message_box_t[2])();
  local_50 = CONCAT44(extraout_var,iVar4);
  __it._M_current =
       (this->m_events).
       super__Vector_base<so_5::impl::subscription_storage_common::subscr_info_t,_std::allocator<so_5::impl::subscription_storage_common::subscr_info_t>_>
       ._M_impl.super__Vector_impl_data._M_start;
  psVar1 = (this->m_events).
           super__Vector_base<so_5::impl::subscription_storage_common::subscr_info_t,_std::allocator<so_5::impl::subscription_storage_common::subscr_info_t>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  lVar6 = (long)psVar1 - (long)__it._M_current;
  lVar7 = lVar6;
  local_48 = msg_type;
  local_40 = local_50;
  local_38 = msg_type;
  for (lVar9 = lVar6 >> 8; _Var8._M_current = __it._M_current, 0 < lVar9; lVar9 = lVar9 + -1) {
    bVar3 = __gnu_cxx::__ops::
            _Iter_pred<so_5::impl::vector_based_subscr_storage::storage_t::drop_subscription_for_all_states(so_5::intrusive_ptr_t<so_5::abstract_message_box_t>const&,std::type_index_const&)::$_0>
            ::operator()((_Iter_pred<so_5::impl::vector_based_subscr_storage::storage_t::drop_subscription_for_all_states(so_5::intrusive_ptr_t<so_5::abstract_message_box_t>const&,std::type_index_const&)::__0>
                          *)&local_50,__it);
    if (bVar3) goto LAB_00245a4f;
    bVar3 = __gnu_cxx::__ops::
            _Iter_pred<so_5::impl::vector_based_subscr_storage::storage_t::drop_subscription_for_all_states(so_5::intrusive_ptr_t<so_5::abstract_message_box_t>const&,std::type_index_const&)::$_0>
            ::operator()((_Iter_pred<so_5::impl::vector_based_subscr_storage::storage_t::drop_subscription_for_all_states(so_5::intrusive_ptr_t<so_5::abstract_message_box_t>const&,std::type_index_const&)::__0>
                          *)&local_50,__it._M_current + 1);
    _Var8._M_current = __it._M_current + 1;
    if (bVar3) goto LAB_00245a4f;
    bVar3 = __gnu_cxx::__ops::
            _Iter_pred<so_5::impl::vector_based_subscr_storage::storage_t::drop_subscription_for_all_states(so_5::intrusive_ptr_t<so_5::abstract_message_box_t>const&,std::type_index_const&)::$_0>
            ::operator()((_Iter_pred<so_5::impl::vector_based_subscr_storage::storage_t::drop_subscription_for_all_states(so_5::intrusive_ptr_t<so_5::abstract_message_box_t>const&,std::type_index_const&)::__0>
                          *)&local_50,__it._M_current + 2);
    _Var8._M_current = __it._M_current + 2;
    if (bVar3) goto LAB_00245a4f;
    bVar3 = __gnu_cxx::__ops::
            _Iter_pred<so_5::impl::vector_based_subscr_storage::storage_t::drop_subscription_for_all_states(so_5::intrusive_ptr_t<so_5::abstract_message_box_t>const&,std::type_index_const&)::$_0>
            ::operator()((_Iter_pred<so_5::impl::vector_based_subscr_storage::storage_t::drop_subscription_for_all_states(so_5::intrusive_ptr_t<so_5::abstract_message_box_t>const&,std::type_index_const&)::__0>
                          *)&local_50,__it._M_current + 3);
    _Var8._M_current = __it._M_current + 3;
    if (bVar3) goto LAB_00245a4f;
    __it._M_current = __it._M_current + 4;
    lVar7 = lVar7 + -0x100;
  }
  lVar7 = lVar7 >> 6;
  if (lVar7 == 1) {
LAB_00245b0b:
    bVar3 = __gnu_cxx::__ops::
            _Iter_pred<so_5::impl::vector_based_subscr_storage::storage_t::drop_subscription_for_all_states(so_5::intrusive_ptr_t<so_5::abstract_message_box_t>const&,std::type_index_const&)::$_0>
            ::operator()((_Iter_pred<so_5::impl::vector_based_subscr_storage::storage_t::drop_subscription_for_all_states(so_5::intrusive_ptr_t<so_5::abstract_message_box_t>const&,std::type_index_const&)::__0>
                          *)&local_50,__it);
    _Var8._M_current = __it._M_current;
    if (!bVar3) {
      _Var8._M_current = psVar1;
    }
  }
  else if (lVar7 == 2) {
LAB_00245af0:
    bVar3 = __gnu_cxx::__ops::
            _Iter_pred<so_5::impl::vector_based_subscr_storage::storage_t::drop_subscription_for_all_states(so_5::intrusive_ptr_t<so_5::abstract_message_box_t>const&,std::type_index_const&)::$_0>
            ::operator()((_Iter_pred<so_5::impl::vector_based_subscr_storage::storage_t::drop_subscription_for_all_states(so_5::intrusive_ptr_t<so_5::abstract_message_box_t>const&,std::type_index_const&)::__0>
                          *)&local_50,__it);
    _Var8._M_current = __it._M_current;
    if (!bVar3) {
      __it._M_current = __it._M_current + 1;
      goto LAB_00245b0b;
    }
  }
  else {
    __first._M_current = psVar1;
    if (lVar7 != 3) goto LAB_00245a8d;
    bVar3 = __gnu_cxx::__ops::
            _Iter_pred<so_5::impl::vector_based_subscr_storage::storage_t::drop_subscription_for_all_states(so_5::intrusive_ptr_t<so_5::abstract_message_box_t>const&,std::type_index_const&)::$_0>
            ::operator()((_Iter_pred<so_5::impl::vector_based_subscr_storage::storage_t::drop_subscription_for_all_states(so_5::intrusive_ptr_t<so_5::abstract_message_box_t>const&,std::type_index_const&)::__0>
                          *)&local_50,__it);
    if (!bVar3) {
      __it._M_current = __it._M_current + 1;
      goto LAB_00245af0;
    }
  }
LAB_00245a4f:
  __first._M_current = _Var8._M_current;
  if (_Var8._M_current != psVar1) {
    while (_Var8._M_current = _Var8._M_current + 1, _Var8._M_current != psVar1) {
      bVar3 = __gnu_cxx::__ops::
              _Iter_pred<so_5::impl::vector_based_subscr_storage::storage_t::drop_subscription_for_all_states(so_5::intrusive_ptr_t<so_5::abstract_message_box_t>const&,std::type_index_const&)::$_0>
              ::operator()((_Iter_pred<so_5::impl::vector_based_subscr_storage::storage_t::drop_subscription_for_all_states(so_5::intrusive_ptr_t<so_5::abstract_message_box_t>const&,std::type_index_const&)::__0>
                            *)&local_40,_Var8);
      if (!bVar3) {
        subscription_storage_common::subscr_info_t::operator=(__first._M_current,_Var8._M_current);
        __first._M_current = __first._M_current + 1;
      }
    }
  }
LAB_00245a8d:
  std::
  vector<so_5::impl::subscription_storage_common::subscr_info_t,_std::allocator<so_5::impl::subscription_storage_common::subscr_info_t>_>
  ::erase(&this->m_events,__first,
          (this->m_events).
          super__Vector_base<so_5::impl::subscription_storage_common::subscr_info_t,_std::allocator<so_5::impl::subscription_storage_common::subscr_info_t>_>
          ._M_impl.super__Vector_impl_data._M_finish);
  if (lVar6 != (long)(this->m_events).
                     super__Vector_base<so_5::impl::subscription_storage_common::subscr_info_t,_std::allocator<so_5::impl::subscription_storage_common::subscr_info_t>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)(this->m_events).
                     super__Vector_base<so_5::impl::subscription_storage_common::subscr_info_t,_std::allocator<so_5::impl::subscription_storage_common::subscr_info_t>_>
                     ._M_impl.super__Vector_impl_data._M_start) {
    paVar2 = mbox->m_obj;
    paVar5 = subscription_storage_t::owner(&this->super_subscription_storage_t);
    UNRECOVERED_JUMPTABLE = paVar2->_vptr_abstract_message_box_t[4];
    (*UNRECOVERED_JUMPTABLE)(paVar2,msg_type,paVar5,UNRECOVERED_JUMPTABLE);
    return;
  }
  return;
}

Assistant:

void
storage_t::drop_subscription_for_all_states(
	const mbox_t & mbox,
	const std::type_index & msg_type )
	{
		using namespace std;

		const auto mbox_id = mbox->id();

		const auto old_size = m_events.size();

		m_events.erase(
				remove_if( begin( m_events ), end( m_events ),
						[mbox_id, &msg_type]( const info_t & i ) {
							return i.m_mbox->id() == mbox_id &&
									i.m_msg_type == msg_type;
						} ),
				end( m_events ) );

		// Note: since v.5.5.9 mbox unsubscription is initiated even if
		// it is MPSC mboxes. It is important for the case of message
		// delivery tracing.

		if( old_size != m_events.size() )
			mbox->unsubscribe_event_handlers( msg_type, owner() );
	}